

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeMemTooBig(Mem *p)

{
  int n;
  Mem *p_local;
  uint local_4;
  
  if ((p->flags & 0x12) == 0) {
    local_4 = 0;
  }
  else {
    n = p->n;
    if ((p->flags & 0x400) != 0) {
      n = (p->u).nZero + n;
    }
    local_4 = (uint)(p->db->aLimit[0] < n);
  }
  return local_4;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemTooBig(Mem *p){
  assert( p->db!=0 );
  if( p->flags & (MEM_Str|MEM_Blob) ){
    int n = p->n;
    if( p->flags & MEM_Zero ){
      n += p->u.nZero;
    }
    return n>p->db->aLimit[SQLITE_LIMIT_LENGTH];
  }
  return 0;
}